

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

bool FIX::Message::isHeaderField(int field,DataDictionary *pD)

{
  bool bVar1;
  DataDictionary *pD_local;
  int field_local;
  
  bVar1 = isHeaderField(field);
  if (bVar1) {
    pD_local._7_1_ = true;
  }
  else if (pD == (DataDictionary *)0x0) {
    pD_local._7_1_ = false;
  }
  else {
    pD_local._7_1_ = DataDictionary::isHeaderField(pD,field);
  }
  return pD_local._7_1_;
}

Assistant:

bool Message::isHeaderField( int field, 
                             const DataDictionary * pD )
{
  if ( isHeaderField( field ) ) return true;
  if ( pD ) return pD->isHeaderField( field );
  return false;
}